

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

appender __thiscall
fmt::v10::detail::digit_grouping<char>::apply<fmt::v10::appender,char>
          (digit_grouping<char> *this,appender out,basic_string_view<char> digits)

{
  char *begin;
  type tVar1;
  ulong uVar2;
  int value;
  ulong uVar3;
  int iVar4;
  int i;
  basic_memory_buffer<int,_500UL,_std::allocator<int>_> separators;
  int local_83c;
  char *local_838;
  next_state local_830;
  basic_memory_buffer<int,_500UL,_std::allocator<int>_> local_820;
  
  uVar2 = digits.size_;
  local_838 = digits.data_;
  local_820.super_buffer<int>.ptr_ = local_820.store_;
  local_820.super_buffer<int>.size_ = 0;
  local_820.super_buffer<int>._vptr_buffer = (_func_int **)&PTR_grow_001d98b0;
  local_820.super_buffer<int>.capacity_ = 500;
  local_830.group._M_current = local_830.group._M_current & 0xffffffff00000000;
  buffer<int>::push_back(&local_820.super_buffer<int>,(int *)&local_830);
  local_830.group._M_current = (this->grouping_)._M_dataplus._M_p;
  local_830.pos = 0;
  while( true ) {
    local_83c = next(this,&local_830);
    if ((local_83c == 0) || ((int)digits.size_ <= local_83c)) break;
    buffer<int>::push_back(&local_820.super_buffer<int>,&local_83c);
  }
  iVar4 = (int)local_820.super_buffer<int>.size_ + -1;
  uVar3 = 0;
  value = 0;
  if (0 < (int)digits.size_) {
    uVar3 = uVar2 & 0xffffffff;
    value = 0;
  }
  for (; (int)uVar3 != value; value = value + 1) {
    if ((int)uVar2 == local_820.super_buffer<int>.ptr_[iVar4]) {
      begin = (this->thousands_sep_)._M_dataplus._M_p;
      buffer<char>::append<char>
                ((buffer<char> *)
                 out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container,begin,
                 begin + (this->thousands_sep_)._M_string_length);
      iVar4 = iVar4 + -1;
    }
    tVar1 = to_unsigned<int>(value);
    local_83c = CONCAT31(local_83c._1_3_,local_838[tVar1]);
    buffer<char>::push_back
              ((buffer<char> *)
               out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container,
               (char *)&local_83c);
    uVar2 = (ulong)((int)uVar2 - 1);
  }
  basic_memory_buffer<int,_500UL,_std::allocator<int>_>::~basic_memory_buffer(&local_820);
  return (appender)
         out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container.container;
}

Assistant:

auto apply(Out out, basic_string_view<C> digits) const -> Out {
    auto num_digits = static_cast<int>(digits.size());
    auto separators = basic_memory_buffer<int>();
    separators.push_back(0);
    auto state = initial_state();
    while (int i = next(state)) {
      if (i >= num_digits) break;
      separators.push_back(i);
    }
    for (int i = 0, sep_index = static_cast<int>(separators.size() - 1);
         i < num_digits; ++i) {
      if (num_digits - i == separators[sep_index]) {
        out =
            copy_str<Char>(thousands_sep_.data(),
                           thousands_sep_.data() + thousands_sep_.size(), out);
        --sep_index;
      }
      *out++ = static_cast<Char>(digits[to_unsigned(i)]);
    }
    return out;
  }